

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this[-1].Name._M_dataplus._M_p = "0{P";
  *(undefined8 *)&this->field_0x58 = 0x882370;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x882348;
  puVar1 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x38;
  puVar2 = &(this->super_IfcNamedUnit).field_0x48;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  puVar1 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x10;
  puVar2 = &(this->super_IfcNamedUnit).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  this[-1].Name._M_dataplus._M_p = (pointer)0x882398;
  *(undefined8 *)&this->field_0x58 = 0x8823c0;
  puVar2 = *(undefined1 **)((long)&this[-1].Name.field_2 + 8);
  if (puVar2 != &this[-1].field_0x98) {
    operator_delete(puVar2,*(long *)&this[-1].field_0x98 + 1);
  }
  operator_delete(&this[-1].Name,0xa8);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}